

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buf_slot.cpp
# Opt level: O0

MPP_RET mpp_buf_slot_clr_flag(MppBufSlots slots,RK_S32 index,SlotUsageType type)

{
  MppBufSlotEntry *slot_00;
  MppBufSlotEntry *slot;
  AutoMutex auto_lock;
  RK_S32 unused;
  MppBufSlotsImpl *impl;
  SlotUsageType type_local;
  RK_S32 index_local;
  MppBufSlots slots_local;
  
  if (slots == (MppBufSlots)0x0) {
    _mpp_log_l(2,"mpp_buf_slot","found NULL input\n","mpp_buf_slot_clr_flag");
    slots_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    auto_lock.mLock._4_4_ = 0;
    Mutex::Autolock::Autolock((Autolock *)&slot,*slots,1);
    if ((index < 0) || (*(int *)((long)slots + 0x60) <= index)) {
      _dump_slots("mpp_buf_slot_clr_flag",(MppBufSlotsImpl *)slots);
      _mpp_log_l(2,"mpp_buf_slot","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "(index >= 0) && (index < impl->buf_count)","mpp_buf_slot_clr_flag",0x425);
      abort();
    }
    slot_00 = (MppBufSlotEntry *)(*(long *)((long)slots + 0xe8) + (long)index * 0x38);
    slot_ops_with_log((MppBufSlotsImpl *)slots,slot_00,clr_flag_op[type],(void *)0x0);
    if (type == SLOT_HAL_OUTPUT) {
      *(int *)((long)slots + 0xc) = *(int *)((long)slots + 0xc) + 1;
    }
    auto_lock.mLock._4_4_ = check_entry_unused((MppBufSlotsImpl *)slots,slot_00);
    Mutex::Autolock::~Autolock((Autolock *)&slot);
    if (auto_lock.mLock._4_4_ != 0) {
      mpp_callback_f("mpp_buf_slot_clr_flag",(MppCbCtx *)((long)slots + 0x78),slots);
    }
    slots_local._4_4_ = MPP_OK;
  }
  return slots_local._4_4_;
}

Assistant:

MPP_RET mpp_buf_slot_clr_flag(MppBufSlots slots, RK_S32 index, SlotUsageType type)
{
    if (NULL == slots) {
        mpp_err_f("found NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppBufSlotsImpl *impl = (MppBufSlotsImpl *)slots;
    RK_S32 unused = 0;
    {
        AutoMutex auto_lock(impl->lock);
        slot_assert(impl, (index >= 0) && (index < impl->buf_count));
        MppBufSlotEntry *slot = &impl->slots[index];
        slot_ops_with_log(impl, slot, clr_flag_op[type], NULL);

        if (type == SLOT_HAL_OUTPUT)
            impl->decode_count++;

        unused = check_entry_unused(impl, slot);
    }

    if (unused)
        mpp_callback(&impl->callback, impl);
    return MPP_OK;
}